

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O3

string * __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
blockers_to_string_abi_cxx11_
          (string *__return_storage_ptr__,
          Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this)

{
  ostream *poVar1;
  _Rb_tree_header *p_Var2;
  Blocker_iterator_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>
  __begin0;
  ostringstream stream;
  Blocker_iterator_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>
  local_1b0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  local_1b0.current_position._M_node =
       (this->blocker_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->blocker_map_)._M_t._M_impl.super__Rb_tree_header;
  local_1b0.end_of_map._M_node = &p_Var2->_M_header;
  while ((_Rb_tree_header *)local_1b0.current_position._M_node != p_Var2) {
    poVar1 = operator<<((ostream *)local_1a0,
                        (Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                         *)local_1b0.current_position._M_node[1]._M_parent);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    Blocker_iterator_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>
    ::goto_next_blocker(&local_1b0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string blockers_to_string() const {
    std::ostringstream stream;

    for (auto b : const_blocker_range())
      stream << *b << std::endl;
    return stream.str();
  }